

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::ClusterList::boxList(ClusterList *this,BoxList *blst)

{
  const_iterator End;
  _List_node_base *p_Var1;
  
  BoxList::clear(blst);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::reserve
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)blst,
             (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
             _M_impl._M_node._M_size);
  p_Var1 = (_List_node_base *)this;
  while (p_Var1 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var1->_M_next)->
                  super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this) {
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)blst,*(value_type **)(p_Var1 + 1))
    ;
  }
  return;
}

Assistant:

void
ClusterList::boxList (BoxList& blst) const
{
    blst.clear();
    blst.reserve(lst.size());
    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        blst.push_back((*cli)->box());
    }
}